

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.cpp
# Opt level: O3

void dlib::http_impl::parse_url(string *word,key_value_map *queries)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  string value;
  string key;
  istringstream sin;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar2 = word->_M_string_length;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      pcVar1 = (word->_M_dataplus)._M_p;
      if (pcVar1[uVar5] == '&') {
        pcVar1[uVar5] = ' ';
        uVar2 = word->_M_string_length;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)word,_S_in);
  std::operator>>((istream *)local_1b0,(string *)word);
  while (((byte)(*(_func_int **)(local_1b0._0_8_ + -0x18))[(long)(local_1b0 + 0x20)] & 5) == 0) {
    lVar3 = std::__cxx11::string::find_first_of((char *)word,0x2c6606,0);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_210,(ulong)word);
      urldecode(&local_1d0,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)word);
      urldecode(&local_210,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&queries->
                             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ,&local_1d0);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    }
    std::operator>>((istream *)local_1b0,(string *)word);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return;
}

Assistant:

void parse_url(
            std::string word, 
            key_value_map& queries
        )
        /*!
            Parses the query string of a URL.  word should be the stuff that comes
            after the ? in the query URL.
        !*/
        {
            std::string::size_type pos;

            for (pos = 0; pos < word.size(); ++pos)
            {
                if (word[pos] == '&')
                    word[pos] = ' ';
            }

            std::istringstream sin(word);
            sin >> word;
            while (sin)
            {
                pos = word.find_first_of("=");
                if (pos != std::string::npos)
                {
                    std::string key = urldecode(word.substr(0,pos));
                    std::string value = urldecode(word.substr(pos+1));

                    queries[key] = value;
                }
                sin >> word;
            }
        }